

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O3

Vec_Ptr_t * Aig_ManRegPartitionSmart(Aig_Man_t *pAig,int nPartSize)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  int iVar4;
  Aig_ManPre_t *p;
  int *piVar5;
  void *__dest;
  void **ppvVar6;
  Vec_Int_t *pVVar7;
  size_t __size;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  
  p = Aig_ManRegManStart(pAig,nPartSize);
  iVar3 = Aig_ManRegFindSeed(p);
  if (-1 < iVar3) {
    pVVar9 = p->vRegs;
    pVVar8 = p->vUniques;
    pVVar7 = p->vFreeVars;
    do {
      pVVar9->nSize = 0;
      pVVar8->nSize = 0;
      pVVar7->nSize = 0;
      p->vPartCost->nSize = 0;
      memset(p->pfPartVars,0,(long)p->pAig->nRegs);
      Aig_ManRegPartitionAdd(p,iVar3);
      iVar3 = p->nRegsMax;
      do {
        iVar4 = pVVar9->nSize;
        if (iVar3 <= iVar4) goto LAB_0063e5ec;
        iVar4 = Aig_ManRegFindBestVar(p);
        if (iVar4 == -1) break;
        Aig_ManRegPartitionAdd(p,iVar4);
      } while (pVVar7->nSize != 0);
      iVar4 = pVVar9->nSize;
LAB_0063e5ec:
      pVVar2 = p->vParts;
      piVar5 = (int *)malloc(0x10);
      piVar5[1] = iVar4;
      *piVar5 = iVar4;
      if (iVar4 == 0) {
        __size = 0;
        __dest = (void *)0x0;
      }
      else {
        __size = (long)iVar4 << 2;
        __dest = malloc(__size);
      }
      *(void **)(piVar5 + 2) = __dest;
      memcpy(__dest,pVVar9->pArray,__size);
      uVar1 = pVVar2->nSize;
      if (uVar1 == pVVar2->nCap) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar6;
          pVVar2->nCap = 0x10;
        }
        else {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
          pVVar2->pArray = ppvVar6;
          pVVar2->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar6 = pVVar2->pArray;
      }
      iVar3 = pVVar2->nSize;
      pVVar2->nSize = iVar3 + 1;
      ppvVar6[iVar3] = piVar5;
      pVVar7 = p->vFreeVars;
      pVVar9 = p->vRegs;
      pVVar8 = p->vUniques;
      printf("Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n",
             (double)pVVar7->nSize / (double)pVVar9->nSize);
      iVar3 = Aig_ManRegFindSeed(p);
    } while (-1 < iVar3);
  }
  pVVar2 = p->vParts;
  p->vParts = (Vec_Ptr_t *)0x0;
  Aig_ManRegManStop(p);
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Aig_ManRegPartitionSmart( Aig_Man_t * pAig, int nPartSize )
{
    extern void Ioa_WriteAiger( Aig_Man_t * pMan, char * pFileName, int fWriteSymbols, int fCompact );

    Aig_ManPre_t * p;
    Vec_Ptr_t * vResult;
    int iSeed, iNext, i, k;
    // create the manager
    p = Aig_ManRegManStart( pAig, nPartSize );
    // add partitions as long as registers remain
    for ( i = 0; (iSeed = Aig_ManRegFindSeed(p)) >= 0; i++ )
    {
//printf( "Seed variable = %d.\n", iSeed );
        // clean the current partition information
        Vec_IntClear( p->vRegs );
        Vec_IntClear( p->vUniques );
        Vec_IntClear( p->vFreeVars );
        Vec_FltClear( p->vPartCost );
        memset( p->pfPartVars, 0, sizeof(char) * Aig_ManRegNum(p->pAig) );
        // add the register and its partition support
        Aig_ManRegPartitionAdd( p, iSeed );
        // select the best var to add
        for ( k = 0; Vec_IntSize(p->vRegs) < p->nRegsMax; k++ )
        {
            // get the next best variable
            iNext = Aig_ManRegFindBestVar( p );
            if ( iNext == -1 )
                break;
            // add the register to the support of the partition
            Aig_ManRegPartitionAdd( p, iNext );
            // report the result
//printf( "Part %3d  Reg %3d : Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i, k, 
//                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
//                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
            // quit if there are not free variables
            if ( Vec_IntSize(p->vFreeVars) == 0 )
                break;
        }
        // add this partition to the set
        Vec_PtrPush( p->vParts, Vec_IntDup(p->vRegs) );        
printf( "Part %3d  SUMMARY:  Free = %4d. Total = %4d. Ratio = %6.2f. Unique = %4d.\n", i,
                Vec_IntSize(p->vFreeVars), Vec_IntSize(p->vRegs), 
                1.0*Vec_IntSize(p->vFreeVars)/Vec_IntSize(p->vRegs), Vec_IntSize(p->vUniques) );
//printf( "\n" ); 
    }
    vResult = p->vParts; p->vParts = NULL;
    Aig_ManRegManStop( p );
    return vResult;
}